

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_info.cpp
# Opt level: O3

string * __thiscall
duckdb::GetStorageVersionName_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,idx_t serialization_version)

{
  long lVar1;
  string *psVar2;
  int iVar3;
  long *plVar4;
  size_type *psVar5;
  char *pcVar6;
  optional_idx oVar7;
  undefined8 *puVar8;
  char *pcVar9;
  idx_t i;
  idx_t iVar10;
  optional_idx min_idx;
  allocator local_61;
  string *local_60;
  optional_idx local_58;
  optional_idx local_50 [2];
  undefined1 local_40 [16];
  
  if (this < (duckdb *)0x4) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "v1.0.0+";
    pcVar6 = "";
  }
  else {
    local_58.index = 0xffffffffffffffff;
    pcVar6 = "v0.10.0";
    oVar7.index = 0xffffffffffffffff;
    puVar8 = (undefined8 *)(serialization_version_info + 0x10);
    iVar10 = 0;
    local_60 = __return_storage_ptr__;
    do {
      iVar3 = strcmp(pcVar6,"latest");
      if ((iVar3 != 0) &&
         ((undefined1 *)oVar7.index == (undefined1 *)0xffffffffffffffff &&
          (duckdb *)puVar8[-1] == this)) {
        optional_idx::optional_idx(local_50,iVar10);
        local_58.index = local_50[0].index;
        oVar7.index = local_50[0].index;
      }
      iVar10 = iVar10 + 1;
      pcVar6 = (char *)*puVar8;
      puVar8 = puVar8 + 2;
    } while (iVar10 != 0xe);
    if ((undefined1 *)oVar7.index != (undefined1 *)0xffffffffffffffff) {
      iVar10 = optional_idx::GetIndex(&local_58);
      ::std::__cxx11::string::string
                ((string *)local_50,*(char **)(serialization_version_info + iVar10 * 0x10),&local_61
                );
      plVar4 = (long *)::std::__cxx11::string::append((char *)local_50);
      psVar2 = local_60;
      (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar5) {
        lVar1 = plVar4[3];
        (local_60->field_2)._M_allocated_capacity = *psVar5;
        *(long *)((long)&local_60->field_2 + 8) = lVar1;
      }
      else {
        (local_60->_M_dataplus)._M_p = (pointer)*plVar4;
        (local_60->field_2)._M_allocated_capacity = *psVar5;
      }
      local_60->_M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((undefined1 *)local_50[0].index == local_40) {
        return local_60;
      }
      operator_delete((void *)local_50[0].index);
      return psVar2;
    }
    (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
    pcVar9 = "--UNKNOWN--";
    pcVar6 = "";
    __return_storage_ptr__ = local_60;
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar9,pcVar6);
  return __return_storage_ptr__;
}

Assistant:

string GetStorageVersionName(idx_t serialization_version) {
	if (serialization_version < 4) {
		// special handling for lower serialization versions
		return "v1.0.0+";
	}
	optional_idx min_idx;
	for (idx_t i = 0; serialization_version_info[i].version_name; i++) {
		if (strcmp(serialization_version_info[i].version_name, "latest") == 0) {
			continue;
		}
		if (serialization_version_info[i].serialization_version != serialization_version) {
			continue;
		}
		if (!min_idx.IsValid()) {
			min_idx = i;
		}
	}
	if (!min_idx.IsValid()) {
		D_ASSERT(0);
		return "--UNKNOWN--";
	}
	auto min_name = serialization_version_info[min_idx.GetIndex()].version_name;
	return string(min_name) + "+";
}